

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int change_mparam(int param_number,int value)

{
  undefined8 local_30;
  size_t val;
  int value_local;
  int param_number_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (value == -1) {
    local_30 = 0xffffffffffffffff;
  }
  else {
    local_30 = (ulong)value;
  }
  if (param_number == -3) {
    mparams.mmap_threshold = local_30;
    value_local = 1;
  }
  else if (param_number == -2) {
    if ((local_30 < mparams.page_size) || ((local_30 & local_30 - 1) != 0)) {
      value_local = 0;
    }
    else {
      mparams.granularity = local_30;
      value_local = 1;
    }
  }
  else if (param_number == -1) {
    mparams.trim_threshold = local_30;
    value_local = 1;
  }
  else {
    value_local = 0;
  }
  return value_local;
}

Assistant:

static int change_mparam(int param_number, int value) {
  size_t val;
  ensure_initialization();
  val = (value == -1)? MAX_SIZE_T : (size_t)value;
  switch(param_number) {
  case M_TRIM_THRESHOLD:
    mparams.trim_threshold = val;
    return 1;
  case M_GRANULARITY:
    if (val >= mparams.page_size && ((val & (val-1)) == 0)) {
      mparams.granularity = val;
      return 1;
    }
    else
      return 0;
  case M_MMAP_THRESHOLD:
    mparams.mmap_threshold = val;
    return 1;
  default:
    return 0;
  }
}